

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O2

void __thiscall
SpecificStrategy::matchAddresses
          (SpecificStrategy *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *aInstrs,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *bInstrs)

{
  iterator iVar1;
  iterator __position;
  
  __position._M_node = (bInstrs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node != &(bInstrs->_M_t)._M_impl.super__Rb_tree_header) {
    iVar1 = std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::find(&aInstrs->_M_t,__position._M_node + 1);
    if ((_Rb_tree_header *)iVar1._M_node == &(aInstrs->_M_t)._M_impl.super__Rb_tree_header) {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
    else {
      __position = std::
                   _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                       *)bInstrs,__position._M_node);
    }
  }
  return;
}

Assistant:

void SpecificStrategy::matchAddresses(std::set<Addr>& aInstrs, std::set<Addr>& bInstrs) {
	for (std::set<Addr>::iterator bIT = bInstrs.begin(),
			bED = bInstrs.end(); bIT != bED; ) {
		std::set<Addr>::iterator aIT = aInstrs.find(*bIT),
				aED = aInstrs.end();
		if (aIT != aED) {
			bIT = bInstrs.erase(bIT);
		} else {
			bIT++;
		}
	}
}